

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hamt_map.hpp
# Opt level: O2

void __thiscall
pstore::index::
hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::iterator_base<false>::move_to_left_most_child(iterator_base<false> *this,index_pointer node)

{
  index_pointer *piVar1;
  internal_node *internal;
  shared_ptr<const_void> store_node;
  internal_node *local_70;
  internal_node *local_68;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_60;
  internal_node **local_58;
  internal_node **local_50;
  index_pointer local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40 [2];
  
  local_68 = (internal_node *)0x0;
  _Stack_60._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  while( true ) {
    while( true ) {
      local_48 = node;
      if (((ulong)node.internal_ & 1) == 0) {
        local_40[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xffffffffffffffff;
        array_stack<pstore::index::details::parent_type,_13UL>::push
                  (&this->visited_parents_,(value_type *)&local_48.addr_);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_60);
        return;
      }
      local_40[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      array_stack<pstore::index::details::parent_type,_13UL>::push
                (&this->visited_parents_,(value_type *)&local_48.addr_);
      if ((this->visited_parents_).elements_ < 0xc) break;
      local_70 = (internal_node *)0x0;
      details::linear_node::get_node
                ((pair<std::shared_ptr<const_pstore::index::details::linear_node>,_const_pstore::index::details::linear_node_*>
                  *)&local_48.addr_,this->db_,node);
      local_50 = &local_68;
      local_58 = &local_70;
      std::tuple<std::shared_ptr<void_const>&,pstore::index::details::linear_node_const*&>::
      operator=((tuple<std::shared_ptr<void_const>&,pstore::index::details::linear_node_const*&> *)
                &local_58,
                (pair<std::shared_ptr<const_pstore::index::details::linear_node>,_const_pstore::index::details::linear_node_*>
                 *)&local_48.addr_);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_40);
      node.internal_ = (internal_node *)details::linear_node::operator[](local_70,0);
    }
    local_70 = (internal_node *)0x0;
    details::internal_node::get_node
              ((pair<std::shared_ptr<const_pstore::index::details::internal_node>,_const_pstore::index::details::internal_node_*>
                *)&local_48.addr_,this->db_,node);
    local_50 = &local_68;
    local_58 = &local_70;
    std::tuple<std::shared_ptr<void_const>&,pstore::index::details::internal_node_const*&>::
    operator=((tuple<std::shared_ptr<void_const>&,pstore::index::details::internal_node_const*&> *)
              &local_58,
              (pair<std::shared_ptr<const_pstore::index::details::internal_node>,_const_pstore::index::details::internal_node_*>
               *)&local_48.addr_);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_40);
    if (local_68 != local_70 && local_68 != (internal_node *)0x0) break;
    piVar1 = details::internal_node::operator[](local_70,0);
    node = *piVar1;
  }
  assert_failed("!store_node || store_node.get () == internal",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/hamt_map.hpp"
                ,0x262);
}

Assistant:

void hamt_map<KeyType, ValueType, Hash, KeyEqual>::iterator_base<
            IsConstIterator>::move_to_left_most_child (index_pointer node) {

            std::shared_ptr<void const> store_node;
            while (!node.is_leaf ()) {
                visited_parents_.push (details::parent_type{node, 0});
                if (visited_parents_.size () <= details::max_internal_depth) {
                    internal_node const * internal = nullptr;
                    std::tie (store_node, internal) = internal_node::get_node (db_, node);
                    PSTORE_ASSERT (!store_node || store_node.get () == internal);
                    node = (*internal)[0];
                } else {
                    linear_node const * linear = nullptr;
                    std::tie (store_node, linear) = linear_node::get_node (db_, node);
                    node = (*linear)[0];
                }
            }

            // Push the leaf on the stack.
            visited_parents_.push (details::parent_type{node});
        }